

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

void __thiscall
icu_63::TimeZoneNamesImpl::ZoneStringsLoader::consumeNamesTable
          (ZoneStringsLoader *this,char *key,ResourceValue *value,UBool noFallback,
          UErrorCode *status)

{
  UHashtable *pUVar1;
  bool bVar2;
  UBool UVar3;
  char *value_00;
  char16_t *key_00;
  void *pvVar4;
  UnicodeString tzID;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  value_00 = (char *)uhash_get_63(this->keyToLoader,key);
  if ((long *)value_00 == (long *)0x0) {
    UVar3 = isMetaZone(this,key);
    if (UVar3 == '\0') {
      tzIDFromKey(&tzID,this,key);
      pUVar1 = this->tzn->fTZNamesMap;
      key_00 = UnicodeString::getTerminatedBuffer(&tzID);
      pvVar4 = uhash_get_63(pUVar1,key_00);
    }
    else {
      mzIDFromKey(&tzID,this,key);
      pUVar1 = this->tzn->fMZNamesMap;
      key_00 = UnicodeString::getTerminatedBuffer(&tzID);
      pvVar4 = uhash_get_63(pUVar1,key_00);
    }
    bVar2 = true;
    if (pvVar4 == (void *)0x0) {
      value_00 = (char *)UMemory::operator_new((UMemory *)0x40,(size_t)key_00);
      if ((long *)value_00 == (long *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        bVar2 = false;
        value_00 = (char *)0x0;
      }
      else {
        *(undefined ***)value_00 = &PTR__ZNamesLoader_003c6f20;
        *(long *)((long)value_00 + 8) = 0;
        *(long *)((long)value_00 + 0x10) = 0;
        *(long *)((long)value_00 + 0x18) = 0;
        *(long *)((long)value_00 + 0x20) = 0;
        *(long *)((long)value_00 + 0x28) = 0;
        *(long *)((long)value_00 + 0x30) = 0;
        *(long *)((long)value_00 + 0x38) = 0;
      }
    }
    else {
      value_00 = "<dummy>";
    }
    UnicodeString::~UnicodeString(&tzID);
    if (!bVar2) {
      return;
    }
    pvVar4 = createKey(this,key,status);
    if (U_ZERO_ERROR < *status) {
      deleteZNamesLoader(value_00);
      return;
    }
    uhash_put_63(this->keyToLoader,pvVar4,value_00,status);
    if (U_ZERO_ERROR < *status) {
      return;
    }
  }
  if (value_00 != "<dummy>") {
    (**(code **)(*(long *)value_00 + 0x18))(value_00,key,value,(int)noFallback,status);
  }
  return;
}

Assistant:

const UChar* getName(UTimeZoneNameType type) const {
        UTimeZoneNameTypeIndex index = getTZNameTypeIndex(type);
        return index >= 0 ? fNames[index] : NULL;
    }